

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ppu_helper.cpp
# Opt level: O1

AttributeCell __thiscall nesvis::PpuHelper::get_attribute_cell(PpuHelper *this,int x,int y)

{
  int iVar1;
  uint uVar2;
  IMmu *pIVar3;
  uint uVar4;
  
  iVar1 = x + 3;
  if (-1 < x) {
    iVar1 = x;
  }
  uVar2 = y + 3;
  if (-1 < y) {
    uVar2 = y;
  }
  uVar4 = (iVar1 >> 2) + (uVar2 & 0xfffffffc) * 2 + 0x23c0;
  pIVar3 = n_e_s::nes::Nes::ppu_mmu(this->nes_);
  uVar2 = (*pIVar3->_vptr_IMmu[3])(pIVar3,(ulong)uVar4 & 0xffff);
  return (AttributeCell)
         ((uint6)(uVar2 & 0xff) |
         (uint6)(((uVar2 & 0xff) >>
                  ((char)x - (char)(x >> 0x1f) & 2U) + ((char)y - (char)(y >> 0x1f) & 2U) * '\x02' &
                 3) << 0x10) | (uint6)uVar4 << 0x20);
}

Assistant:

PpuHelper::AttributeCell PpuHelper::get_attribute_cell(int x, int y) {
    // TODO(jn) handle mirroring, this will not work
    // Each attribute cell has 4 tiles in it
    const int attribute_x = x / 4;
    const int attribute_y = y / 4;
    const uint16_t address = 0x23C0 + attribute_y * 8 + attribute_x;
    const uint8_t attribute_raw = nes_->ppu_mmu().read_byte(address);

    // Each attribute byte controls 2 tiles
    // Unpack: value = (bottomright << 6) | (bottomleft << 4) |
    //                 (topright << 2)    | (topleft << 0)
    const int x2 = x / 2;
    const int y2 = y / 2;
    const uint8_t shift = 2u * (x2 % 2u) + 4u * (y2 % 2u);
    const uint8_t attr_shifted = attribute_raw >> shift;
    const uint8_t palette = attr_shifted & 0b11u;

    return {.attribute = attribute_raw, .palette = palette, .address = address};
}